

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O0

Status __thiscall leveldb::log::Writer::AddRecord(Writer *this,Slice *slice)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  Status *ptr_00;
  Status *pSVar5;
  Writer *in_RDX;
  undefined8 *in_RSI;
  Status *in_RDI;
  bool end;
  RecordType type;
  size_t fragment_length;
  size_t avail;
  int leftover;
  bool begin;
  size_t left;
  char *ptr;
  Status *s;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  Status *in_stack_ffffffffffffff70;
  Slice local_48;
  undefined1 local_38 [8];
  undefined2 in_stack_ffffffffffffffd4;
  undefined1 uVar6;
  undefined1 uVar7;
  
  pcVar4 = Slice::data((Slice *)in_RDX);
  ptr_00 = (Status *)Slice::size((Slice *)in_RDX);
  uVar7 = 0;
  Status::Status(in_RDI);
  uVar6 = 1;
  do {
    iVar3 = 0x8000 - *(int *)(in_RSI + 1);
    if (iVar3 < 7) {
      if (0 < iVar3) {
        plVar1 = (long *)*in_RSI;
        Slice::Slice(&local_48,"",(long)iVar3);
        (**(code **)(*plVar1 + 0x10))(local_38,plVar1,&local_48);
        Status::~Status(in_stack_ffffffffffffff70);
      }
      *(undefined4 *)(in_RSI + 1) = 0;
    }
    pSVar5 = (Status *)(long)(0x7ff9 - *(int *)(in_RSI + 1));
    if (ptr_00 < pSVar5) {
      pSVar5 = ptr_00;
    }
    in_stack_ffffffffffffff70 = pSVar5;
    EmitPhysicalRecord(in_RDX,(RecordType)((ulong)pcVar4 >> 0x20),(char *)ptr_00,
                       CONCAT17(uVar7,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffffd4,iVar3))));
    Status::operator=(in_stack_ffffffffffffff70,
                      (Status *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    Status::~Status(in_stack_ffffffffffffff70);
    pcVar4 = pcVar4 + (long)&pSVar5->state_;
    ptr_00 = (Status *)((long)ptr_00 - (long)pSVar5);
    uVar6 = 0;
    bVar2 = Status::ok(in_RDI);
    in_stack_ffffffffffffff6f = bVar2 && ptr_00 != (Status *)0x0;
  } while ((bool)in_stack_ffffffffffffff6f);
  return (Status)(char *)in_RDI;
}

Assistant:

Status Writer::AddRecord(const Slice& slice) {
  const char* ptr = slice.data();
  size_t left = slice.size();

  // Fragment the record if necessary and emit it.  Note that if slice
  // is empty, we still want to iterate once to emit a single
  // zero-length record
  Status s;
  bool begin = true;
  do {
    const int leftover = kBlockSize - block_offset_;
    assert(leftover >= 0);
    if (leftover < kHeaderSize) {
      // Switch to a new block
      if (leftover > 0) {
        // Fill the trailer (literal below relies on kHeaderSize being 7)
        static_assert(kHeaderSize == 7, "");
        dest_->Append(Slice("\x00\x00\x00\x00\x00\x00", leftover));
      }
      block_offset_ = 0;
    }

    // Invariant: we never leave < kHeaderSize bytes in a block.
    assert(kBlockSize - block_offset_ - kHeaderSize >= 0);

    const size_t avail = kBlockSize - block_offset_ - kHeaderSize;
    const size_t fragment_length = (left < avail) ? left : avail;

    RecordType type;
    const bool end = (left == fragment_length);
    if (begin && end) {
      type = kFullType;
    } else if (begin) {
      type = kFirstType;
    } else if (end) {
      type = kLastType;
    } else {
      type = kMiddleType;
    }

    s = EmitPhysicalRecord(type, ptr, fragment_length);
    ptr += fragment_length;
    left -= fragment_length;
    begin = false;
  } while (s.ok() && left > 0);
  return s;
}